

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  int i;
  uint16_t t16 [32];
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe c;
  secp256k1_fe *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int iVar1;
  undefined1 local_198 [64];
  short local_158 [16];
  short local_138 [16];
  short local_118 [16];
  byte local_f8 [16];
  uint16_t *in_stack_ffffffffffffff18;
  uint16_t *in_stack_ffffffffffffff20;
  uint16_t *in_stack_ffffffffffffff28;
  uint16_t *in_stack_ffffffffffffff30;
  byte local_b8 [40];
  secp256k1_fe local_90;
  secp256k1_fe local_68;
  secp256k1_fe local_40;
  int local_14;
  void *local_10;
  void *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(&local_40,in_RDI,0x28);
  if (local_14 == 0) {
    secp256k1_fe_impl_mul
              ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58,(secp256k1_fe *)0x133fac);
  }
  else {
    secp256k1_fe_impl_sqr
              ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
  }
  memcpy(&local_68,local_8,0x28);
  memcpy(&local_90,local_10,0x28);
  secp256k1_fe_impl_normalize_var(&local_40);
  secp256k1_fe_impl_normalize_var(&local_68);
  secp256k1_fe_impl_normalize_var(&local_90);
  secp256k1_fe_impl_get_b32(local_b8,&local_68);
  secp256k1_fe_impl_get_b32(&stack0xffffffffffffff28,&local_90);
  secp256k1_fe_impl_get_b32(local_f8,&local_40);
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    local_118[iVar1] =
         (ushort)local_b8[iVar1 * -2 + 0x1f] + (ushort)local_b8[iVar1 * -2 + 0x1e] * 0x100;
    local_138[iVar1] =
         (ushort)local_b8[(long)(iVar1 * -2 + 0x1f) + -0x20] +
         (ushort)local_b8[(long)(iVar1 * -2 + 0x1e) + -0x20] * 0x100;
    local_158[iVar1] =
         (ushort)local_f8[iVar1 * -2 + 0x1f] + (ushort)local_f8[iVar1 * -2 + 0x1e] * 0x100;
  }
  mulmod256(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
            in_stack_ffffffffffffff18);
  iVar1 = secp256k1_memcmp_var(local_198,local_158,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xc4c,"test condition failed: secp256k1_memcmp_var(t16, c16, 32) == 0");
    abort();
  }
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}